

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O3

void __thiscall kratos::AssertionVisitor::visit(AssertionVisitor *this,AssertBase *stmt)

{
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar1;
  pointer ppVar2;
  _Alloc_hider _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *this_01;
  undefined1 auVar4 [8];
  int iVar5;
  Generator *pGVar6;
  const_iterator cVar7;
  Const *pCVar8;
  AssertValueStmt *st_1;
  long lVar9;
  initializer_list<std::shared_ptr<kratos::Var>_> __l;
  undefined1 local_f8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  undefined1 local_c8 [8];
  shared_ptr<kratos::FunctionCallVar> else_call;
  shared_ptr<kratos::Var> filename_var;
  shared_ptr<kratos::Var> line_num_var;
  shared_ptr<kratos::GeneratorConst> gen_var;
  shared_ptr<kratos::FunctionCallStmt> else_stmt;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  undefined1 local_50 [8];
  undefined1 local_48 [8];
  shared_ptr<kratos::AssertPropertyStmt> st;
  
  if ((stmt->super_Stmt).super_IRNode.fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (stmt->super_Stmt).super_IRNode.fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pGVar6 = Stmt::generator_parent(&stmt->super_Stmt);
    cVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::FunctionStmtBlock>_>_>_>
            ::find(&(pGVar6->funcs_)._M_t,(key_type *)&hgdb_assert_fail_abi_cxx11_);
    if ((_Rb_tree_header *)cVar7._M_node == &(pGVar6->funcs_)._M_t._M_impl.super__Rb_tree_header) {
      Generator::builtin_function((Generator *)local_f8,(string *)pGVar6);
      if ((pointer)local_f8._8_8_ != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
      }
    }
    ppVar2 = (stmt->super_Stmt).super_IRNode.fn_name_ln.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var3._M_p = (ppVar2->first)._M_dataplus._M_p;
    local_f8._16_8_ = &local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_f8 + 0x10),_Var3._M_p,_Var3._M_p + (ppVar2->first)._M_string_length)
    ;
    pCVar8 = Const::constant((string *)(local_f8 + 0x10),(int)(ppVar2->first)._M_string_length << 3)
    ;
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
               &else_call.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
               &(pCVar8->super_Var).super_enable_shared_from_this<kratos::Var>);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._16_8_ != &local_d8) {
      operator_delete((void *)local_f8._16_8_,local_d8._M_allocated_capacity + 1);
    }
    pCVar8 = Const::constant((ulong)ppVar2->second,0x20,false);
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
               &filename_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                &(pCVar8->super_Var).super_enable_shared_from_this<kratos::Var>);
    std::__shared_ptr<kratos::GeneratorConst,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<kratos::GeneratorConst>,kratos::Generator&>
              ((__shared_ptr<kratos::GeneratorConst,(__gnu_cxx::_Lock_policy)2> *)
               &line_num_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,(_Sp_alloc_shared_tag<std::allocator<kratos::GeneratorConst>_>)
                &gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount,pGVar6);
    pGVar6 = Stmt::generator_parent(&stmt->super_Stmt);
    this_01 = gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
         line_num_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pvVar1 = &((gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Const).super_Var.super_IRNode.fn_name_ln;
        *(int *)&(pvVar1->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar1->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        pvVar1 = &((gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_Const).super_Var.super_IRNode.fn_name_ln;
        *(int *)&(pvVar1->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar1->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    if (filename_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pvVar1 = &((filename_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_IRNode).fn_name_ln;
        *(int *)&(pvVar1->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar1->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        pvVar1 = &((filename_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_IRNode).fn_name_ln;
        *(int *)&(pvVar1->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar1->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    if (line_num_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        pvVar1 = &((line_num_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_IRNode).fn_name_ln;
        *(int *)&(pvVar1->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar1->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
        UNLOCK();
      }
      else {
        pvVar1 = &((line_num_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                  ->super_IRNode).fn_name_ln;
        *(int *)&(pvVar1->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                 )._M_impl.super__Vector_impl_data._M_start =
             *(int *)&(pvVar1->
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + 1;
      }
    }
    __l._M_len = 3;
    __l._M_array = (iterator)
                   &gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount;
    std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
    vector((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> *)
           local_48,__l,(allocator_type *)&local_58);
    Generator::call(pGVar6,(string *)&hgdb_assert_fail_abi_cxx11_,
                    (vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>
                     *)local_48);
    Var::as<kratos::FunctionCallVar>((Var *)local_c8);
    std::vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_>::
    ~vector((vector<std::shared_ptr<kratos::Var>,_std::allocator<std::shared_ptr<kratos::Var>_>_> *)
            local_48);
    lVar9 = 0x30;
    do {
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                 ((long)&gen_var.
                         super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr + lVar9);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      lVar9 = lVar9 + -0x10;
    } while (lVar9 != 0);
    std::__shared_ptr<kratos::FunctionCallStmt,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<kratos::FunctionCallStmt>,std::shared_ptr<kratos::FunctionCallVar>&>
              ((__shared_ptr<kratos::FunctionCallStmt,(__gnu_cxx::_Lock_policy)2> *)
               &gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(allocator<kratos::FunctionCallStmt> *)local_48,
               (shared_ptr<kratos::FunctionCallVar> *)local_c8);
    iVar5 = (*(stmt->super_Stmt).super_IRNode._vptr_IRNode[0xd])(stmt);
    if (iVar5 == 0) {
      local_48 = (undefined1  [8])
                 gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
      st.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this_01;
      if (this_01 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar1 = &(this_01->super_Const).super_Var.super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar1 = &(this_01->super_Const).super_Var.super_IRNode.fn_name_ln;
          *(int *)&(pvVar1->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar1->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      stmt[1].super_Stmt.super_IRNode.fn_name_ln.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &stmt[1].super_Stmt.super_IRNode.fn_name_ln.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&st);
      (**(code **)(*(long *)local_48 + 0x38))(local_48,stmt);
    }
    else {
      Stmt::as<kratos::AssertPropertyStmt>((Stmt *)local_48);
      auVar4 = local_48;
      if (*(int *)(((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_48 + 0xc0))->
                   _vptr__Sp_counted_base + 10) == 8) {
        local_58._M_pi =
             gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        local_50 = (undefined1  [8])this_01;
        if (this_01 != (element_type *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            pvVar1 = &(this_01->super_Const).super_Var.super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
            UNLOCK();
          }
          else {
            pvVar1 = &(this_01->super_Const).super_Var.super_IRNode.fn_name_ln;
            *(int *)&(pvVar1->
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                     )._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&(pvVar1->
                          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + 1;
          }
        }
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_48 + 200) =
             gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_48 + 0xd0),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_50);
        (*(local_58._M_pi)->_vptr__Sp_counted_base[7])(local_58._M_pi,auVar4);
        if (local_50 != (undefined1  [8])0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50);
        }
      }
    }
    if (st.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 st.super___shared_ptr<kratos::AssertPropertyStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    if (this_01 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_01);
    }
    if (else_call.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 else_call.super___shared_ptr<kratos::FunctionCallVar,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    if (gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 gen_var.super___shared_ptr<kratos::GeneratorConst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
    if (line_num_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 line_num_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
    if (filename_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 filename_var.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  return;
}

Assistant:

void visit(AssertBase *stmt) override {
        if (stmt->fn_name_ln.empty()) return;
        auto *generator = stmt->generator_parent();
        if (!generator->has_function(hgdb_assert_fail)) {
            generator->builtin_function(hgdb_assert_fail);
        }
        auto const &[filename, line_num] = stmt->fn_name_ln[0];
        auto filename_var = Const::constant(filename, filename.size() * 8).shared_from_this();
        auto line_num_var =
            Const::constant(static_cast<int64_t>(line_num), 32, false).shared_from_this();
        auto gen_var = std::make_shared<GeneratorConst>(*generator);
        auto else_call = stmt->generator_parent()
                             ->call(hgdb_assert_fail, {gen_var, filename_var, line_num_var})
                             .as<FunctionCallVar>();
        auto else_stmt = std::make_shared<FunctionCallStmt>(else_call);
        if (stmt->assert_type() == AssertType::AssertValue) {
            auto *st = reinterpret_cast<AssertValueStmt *>(stmt);
            st->set_else(else_stmt);
        } else {
            auto st = stmt->as<AssertPropertyStmt>();
            auto *prop = st->property();
            if (prop->action() == PropertyAction::Assert) {
                st->set_else(else_stmt);
            }
        }
    }